

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

rfc5444_result oonf_rfc5444_send_if(oonf_rfc5444_target *target,uint8_t msgid)

{
  oonf_rfc5444_protocol *poVar1;
  oonf_log_source oVar2;
  char cVar3;
  undefined8 uVar4;
  _Bool local_a1;
  undefined1 local_a0 [8];
  netaddr_str buf;
  uint8_t addr_len;
  uint8_t msgid_local;
  oonf_rfc5444_target *target_local;
  
  local_a1 = false;
  buf.buf[0x37] = msgid;
  unique0x10000150 = target;
  if (target != (oonf_rfc5444_target *)0x0) {
    local_a1 = oonf_packet_managed_is_active(&target->interface->_socket,(uint)(target->dst)._type);
  }
  cVar3 = buf.buf[0x37];
  oVar2 = _oonf_rfc5444_subsystem.logging;
  if (local_a1 == false) {
    target_local._4_4_ = RFC5444_OKAY;
  }
  else {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      poVar1 = stack0xffffffffffffffa0->interface->protocol;
      uVar4 = netaddr_to_prefixstring(local_a0,&stack0xffffffffffffffa0->dst,0);
      oonf_log(2,oVar2,"src/base/oonf_rfc5444.c",0x192,0,0,
               "Create message id %d for protocol %s/target %s on interface %s",cVar3,poVar1,uVar4,
               stack0xffffffffffffffa0->interface);
    }
    buf.buf[0x36] = '\x10';
    if ((stack0xffffffffffffffa0->dst)._type == '\x02') {
      buf.buf[0x36] = '\x04';
    }
    target_local._4_4_ =
         rfc5444_writer_create_message
                   (&stack0xffffffffffffffa0->interface->protocol->writer,buf.buf[0x37],
                    buf.buf[0x36],_cb_single_target_selector,stack0xffffffffffffffa0);
  }
  return target_local._4_4_;
}

Assistant:

enum rfc5444_result
oonf_rfc5444_send_if(struct oonf_rfc5444_target *target, uint8_t msgid)
{
  uint8_t addr_len;

#ifdef OONF_LOG_INFO
  struct netaddr_str buf;
#endif

  /* check if socket can send data */
  if (!oonf_rfc5444_is_target_active(target)) {
    return RFC5444_OKAY;
  }

  /* create message */
  OONF_INFO(LOG_RFC5444, "Create message id %d for protocol %s/target %s on interface %s", msgid,
    target->interface->protocol->name, netaddr_to_string(&buf, &target->dst), target->interface->name);

  addr_len = netaddr_get_address_family(&target->dst) == AF_INET ? 4 : 16;
  return rfc5444_writer_create_message(
    &target->interface->protocol->writer, msgid, addr_len, _cb_single_target_selector, target);
}